

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O3

void __thiscall QPDF::copyStreamData(QPDF *this,QPDFObjectHandle *result,QPDFObjectHandle *foreign)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *__v;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  _Alloc_hider _Var3;
  size_type sVar4;
  element_type *peVar5;
  undefined8 this_01;
  __index_type _Var6;
  QPDF *pQVar7;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar8;
  CopiedStreamDataProvider *pCVar9;
  StreamDataProvider *pSVar10;
  Members *pMVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  logic_error *this_02;
  string local_158;
  shared_ptr<QPDF::ForeignStreamData> foreign_stream_data;
  long *local_128 [2];
  long local_118 [2];
  QPDFObjectHandle local_108;
  Stream stream;
  QPDFObjectHandle dict;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> stream_provider;
  QPDFObjGen local_og;
  QPDFObjectHandle local_b0;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_a0;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_90;
  shared_ptr<Buffer> local_80;
  QPDFObjectHandle old_dict;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  QPDFObjectHandle local_40;
  
  QPDFObjectHandle::getDict(&dict);
  QPDFObjectHandle::getDict(&old_dict);
  if (((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->copied_stream_data_provider ==
      (CopiedStreamDataProvider *)0x0) {
    pCVar9 = (CopiedStreamDataProvider *)operator_new(0x78);
    QPDFObjectHandle::StreamDataProvider::StreamDataProvider((StreamDataProvider *)pCVar9,true);
    (pCVar9->super_StreamDataProvider)._vptr_StreamDataProvider =
         (_func_int **)&PTR__CopiedStreamDataProvider_002ea8c8;
    ((StreamDataProvider *)&pCVar9->destination_qpdf)->_vptr_StreamDataProvider = (_func_int **)this
    ;
    pSVar10 = (StreamDataProvider *)((long)&pCVar9->foreign_streams + 8);
    *(undefined4 *)
     &((StreamDataProvider *)((long)&pCVar9->foreign_streams + 8))->_vptr_StreamDataProvider = 0;
    *(undefined8 *)&((StreamDataProvider *)((long)&pCVar9->foreign_streams + 8))->supports_retry = 0
    ;
    ((StreamDataProvider *)((long)&pCVar9->foreign_streams + 0x18))->_vptr_StreamDataProvider =
         (_func_int **)pSVar10;
    *(StreamDataProvider **)
     &((StreamDataProvider *)((long)&pCVar9->foreign_streams + 0x18))->supports_retry = pSVar10;
    ((StreamDataProvider *)((long)&pCVar9->foreign_streams + 0x28))->_vptr_StreamDataProvider =
         (_func_int **)0x0;
    pSVar10 = (StreamDataProvider *)((long)&pCVar9->foreign_stream_data + 8);
    *(undefined4 *)
     &((StreamDataProvider *)((long)&pCVar9->foreign_stream_data + 8))->_vptr_StreamDataProvider = 0
    ;
    *(undefined8 *)&((StreamDataProvider *)((long)&pCVar9->foreign_stream_data + 8))->supports_retry
         = 0;
    ((StreamDataProvider *)((long)&pCVar9->foreign_stream_data + 0x18))->_vptr_StreamDataProvider =
         (_func_int **)pSVar10;
    *(StreamDataProvider **)
     &((StreamDataProvider *)((long)&pCVar9->foreign_stream_data + 0x18))->supports_retry = pSVar10;
    ((StreamDataProvider *)((long)&pCVar9->foreign_stream_data + 0x28))->_vptr_StreamDataProvider =
         (_func_int **)0x0;
    ((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
     super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->copied_stream_data_provider =
         pCVar9;
    local_158._M_dataplus._M_p =
         (pointer)((this->m)._M_t.
                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                  copied_stream_data_provider;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QPDF::CopiedStreamDataProvider*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_158._M_string_length,
               (CopiedStreamDataProvider *)local_158._M_dataplus._M_p);
    sVar4 = local_158._M_string_length;
    _Var3._M_p = local_158._M_dataplus._M_p;
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    local_158._M_dataplus._M_p = (pointer)0x0;
    local_158._M_string_length = 0;
    this_00._M_pi =
         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(_Var2._M_head_impl)->copied_streams + 8))->_M_pi;
    *(pointer *)
     &((_Var2._M_head_impl)->copied_streams).
      super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> =
         _Var3._M_p;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var2._M_head_impl)->copied_streams + 8)
    )->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
    if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
    }
  }
  local_og = QPDFObjectHandle::getObjGen(result);
  paVar1 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"unable to retrieve owning qpdf from foreign stream","");
  pQVar7 = QPDFObjectHandle::getQPDF(foreign,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  __v = (foreign->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr;
  if (__v != (element_type *)0x0) {
    _Var6 = (__v->value).
            super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            ._M_index;
    if (_Var6 == '\x0f') {
      pvVar8 = std::
               get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (&__v->value);
LAB_0013c24e:
      _Var6 = *(__index_type *)
               ((long)&(((pvVar8->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->value).
                       super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               + 0x30);
    }
    else if (_Var6 == '\r') {
      pvVar8 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                *)resolve(__v->qpdf,*(QPDFObjGen *)&(__v->og).obj);
      goto LAB_0013c24e;
    }
    if (_Var6 == '\n') {
      stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (foreign->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (foreign->super_BaseHandle).obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (stream.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (stream.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      if (stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        ::qpdf::Stream::getStreamDataBuffer((Stream *)&local_d8);
        if ((((pQVar7->m)._M_t.
              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
              super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->immediate_copy_from ==
             true) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_allocated_capacity ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0)) {
          QPDFObjectHandle::getRawStreamData(&local_40);
          local_158._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Filter","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&stream_provider,(string *)&old_dict);
          local_128[0] = local_118;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/DecodeParms","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&foreign_stream_data,(string *)&old_dict);
          QPDFObjectHandle::replaceStreamData
                    (foreign,(shared_ptr<Buffer> *)&local_40,(QPDFObjectHandle *)&stream_provider,
                     (QPDFObjectHandle *)&foreign_stream_data);
          if (foreign_stream_data.
              super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (foreign_stream_data.
                       super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_128[0] != local_118) {
            operator_delete(local_128[0],local_118[0] + 1);
          }
          if (stream_provider.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (stream_provider.
                       super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar1) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if (local_40.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          ::qpdf::Stream::getStreamDataBuffer((Stream *)&local_158);
          this_01 = local_d8._8_8_;
          local_d8._8_8_ = local_158._M_string_length;
          local_d8._M_allocated_capacity = (size_type)local_158._M_dataplus._M_p;
          local_158._M_dataplus._M_p = (pointer)0x0;
          local_158._M_string_length = 0;
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
          }
        }
        ::qpdf::Stream::getStreamDataProvider((Stream *)&stream_provider);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_allocated_capacity ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          if (stream_provider.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr == (element_type *)0x0) {
            _Var2._M_head_impl =
                 (pQVar7->m)._M_t.
                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                 super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
            local_158._M_dataplus._M_p = (pointer)QPDFObjectHandle::getParsedOffset(foreign);
            pMVar11 = ::qpdf::Stream::stream(&stream);
            local_128[0] = (long *)pMVar11->length;
            local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_1_ = ::qpdf::Stream::isRootMetadata(&stream);
            foreign_stream_data.
            super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<QPDF::ForeignStreamData,std::allocator<QPDF::ForeignStreamData>,std::shared_ptr<QPDF::EncryptionParameters>&,std::shared_ptr<InputSource>&,QPDFObjectHandle&,long_long,unsigned_long,QPDFObjectHandle&,bool>
                      (&foreign_stream_data.
                        super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(ForeignStreamData **)&foreign_stream_data,
                       (allocator<QPDF::ForeignStreamData> *)&local_108,&(_Var2._M_head_impl)->encp,
                       &(_Var2._M_head_impl)->file,foreign,(longlong *)&local_158,
                       (unsigned_long *)local_128,&dict,(bool *)&local_b0);
            peVar5 = foreign_stream_data.
                     super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            pCVar9 = ((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                     copied_stream_data_provider;
            local_58._M_pi =
                 foreign_stream_data.
                 super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
            if (foreign_stream_data.
                super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (foreign_stream_data.
                 super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)->_M_use_count =
                     (foreign_stream_data.
                      super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (foreign_stream_data.
                 super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)->_M_use_count =
                     (foreign_stream_data.
                      super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            pmVar13 = std::
                      map<QPDFObjGen,_std::shared_ptr<QPDF::ForeignStreamData>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::shared_ptr<QPDF::ForeignStreamData>_>_>_>
                      ::operator[](&pCVar9->foreign_stream_data,&local_og);
            (pmVar13->super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr = peVar5;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(pmVar13->
                        super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount,&local_58);
            if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
            }
            _Var2._M_head_impl =
                 (this->m)._M_t.
                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                 super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
            local_a0.
            super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = ((_Var2._M_head_impl)->copied_streams).
                     super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            local_a0.
            super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(_Var2._M_head_impl)->copied_streams + 8))->_M_pi;
            if (local_a0.
                super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_a0.
                 super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_a0.
                      super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_a0.
                 super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_a0.
                      super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_158._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Filter","");
            QPDFObjectHandle::getKey(&local_108,(string *)&dict);
            local_128[0] = local_118;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/DecodeParms","");
            QPDFObjectHandle::getKey(&local_b0,(string *)&dict);
            QPDFObjectHandle::replaceStreamData(result,&local_a0,&local_108,&local_b0);
            if (local_b0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_b0.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if (local_128[0] != local_118) {
              operator_delete(local_128[0],local_118[0] + 1);
            }
            if (local_108.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_108.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != paVar1) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_a0.
                super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_a0.
                         super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
          }
          else {
            pCVar9 = ((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                     copied_stream_data_provider;
            local_50 = (foreign->super_BaseHandle).obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_48._M_pi =
                 (foreign->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
              }
            }
            pmVar12 = std::
                      map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                      ::operator[](&pCVar9->foreign_streams,&local_og);
            (pmVar12->super_BaseHandle).obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_50;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(pmVar12->super_BaseHandle).obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       &local_48);
            if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
            }
            _Var2._M_head_impl =
                 (this->m)._M_t.
                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                 super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
            local_90.
            super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = ((_Var2._M_head_impl)->copied_streams).
                     super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            local_90.
            super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(_Var2._M_head_impl)->copied_streams + 8))->_M_pi;
            if (local_90.
                super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_90.
                 super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_90.
                      super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_90.
                 super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_90.
                      super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_158._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Filter","");
            QPDFObjectHandle::getKey((QPDFObjectHandle *)&foreign_stream_data,(string *)&dict);
            local_128[0] = local_118;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/DecodeParms","");
            QPDFObjectHandle::getKey(&local_108,(string *)&dict);
            QPDFObjectHandle::replaceStreamData
                      (result,&local_90,(QPDFObjectHandle *)&foreign_stream_data,&local_108);
            if (local_108.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_108.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if (local_128[0] != local_118) {
              operator_delete(local_128[0],local_118[0] + 1);
            }
            if (foreign_stream_data.
                super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (foreign_stream_data.
                         super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            foreign_stream_data.
            super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_90.
                    super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != paVar1) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
              foreign_stream_data.
              super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = local_90.
                      super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            }
          }
        }
        else {
          local_80.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_d8._M_allocated_capacity;
          local_80.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
            }
          }
          local_158._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Filter","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&foreign_stream_data,(string *)&dict);
          local_128[0] = local_118;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/DecodeParms","");
          QPDFObjectHandle::getKey(&local_108,(string *)&dict);
          QPDFObjectHandle::replaceStreamData
                    (result,&local_80,(QPDFObjectHandle *)&foreign_stream_data,&local_108);
          if (local_108.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_108.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (local_128[0] != local_118) {
            operator_delete(local_128[0],local_118[0] + 1);
          }
          if (foreign_stream_data.
              super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (foreign_stream_data.
                       super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          foreign_stream_data.
          super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = local_80.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar1) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
            foreign_stream_data.
            super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_80.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          }
        }
        if (foreign_stream_data.
            super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (foreign_stream_data.
                     super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (stream_provider.
            super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (stream_provider.
                     super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
        }
        if (stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (stream.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (old_dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (old_dict.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (dict.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        return;
      }
      goto LAB_0013c970;
    }
  }
  stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0013c970:
  this_02 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_02,"unable to retrieve underlying stream object from foreign stream");
  __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDF::copyStreamData(QPDFObjectHandle result, QPDFObjectHandle foreign)
{
    // This method was originally written for copying foreign streams, but it is used by
    // QPDFObjectHandle to copy streams from the same QPDF object as well.

    QPDFObjectHandle dict = result.getDict();
    QPDFObjectHandle old_dict = foreign.getDict();
    if (m->copied_stream_data_provider == nullptr) {
        m->copied_stream_data_provider = new CopiedStreamDataProvider(*this);
        m->copied_streams =
            std::shared_ptr<QPDFObjectHandle::StreamDataProvider>(m->copied_stream_data_provider);
    }
    QPDFObjGen local_og(result.getObjGen());
    // Copy information from the foreign stream so we can pipe its data later without keeping the
    // original QPDF object around.

    QPDF& foreign_stream_qpdf =
        foreign.getQPDF("unable to retrieve owning qpdf from foreign stream");

    auto stream = foreign.as_stream();
    if (!stream) {
        throw std::logic_error("unable to retrieve underlying stream object from foreign stream");
    }
    std::shared_ptr<Buffer> stream_buffer = stream.getStreamDataBuffer();
    if ((foreign_stream_qpdf.m->immediate_copy_from) && (stream_buffer == nullptr)) {
        // Pull the stream data into a buffer before attempting the copy operation. Do it on the
        // source stream so that if the source stream is copied multiple times, we don't have to
        // keep duplicating the memory.
        QTC::TC("qpdf", "QPDF immediate copy stream data");
        foreign.replaceStreamData(
            foreign.getRawStreamData(),
            old_dict.getKey("/Filter"),
            old_dict.getKey("/DecodeParms"));
        stream_buffer = stream.getStreamDataBuffer();
    }
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider> stream_provider =
        stream.getStreamDataProvider();
    if (stream_buffer.get()) {
        QTC::TC("qpdf", "QPDF copy foreign stream with buffer");
        result.replaceStreamData(
            stream_buffer, dict.getKey("/Filter"), dict.getKey("/DecodeParms"));
    } else if (stream_provider.get()) {
        // In this case, the remote stream's QPDF must stay in scope.
        QTC::TC("qpdf", "QPDF copy foreign stream with provider");
        m->copied_stream_data_provider->registerForeignStream(local_og, foreign);
        result.replaceStreamData(
            m->copied_streams, dict.getKey("/Filter"), dict.getKey("/DecodeParms"));
    } else {
        auto foreign_stream_data = std::make_shared<ForeignStreamData>(
            foreign_stream_qpdf.m->encp,
            foreign_stream_qpdf.m->file,
            foreign,
            foreign.getParsedOffset(),
            stream.getLength(),
            dict,
            stream.isRootMetadata());
        m->copied_stream_data_provider->registerForeignStream(local_og, foreign_stream_data);
        result.replaceStreamData(
            m->copied_streams, dict.getKey("/Filter"), dict.getKey("/DecodeParms"));
    }
}